

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

_Bool MatrixCompareLoose(Matrix *a,Matrix *b,Real error)

{
  ulong uVar1;
  Matrix *a_00;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  uVar1 = (ulong)a->rows;
  if ((a->rows == b->rows) && (a->columns == b->columns)) {
    bVar3 = a->rows == 0;
    if (!bVar3) {
      a_00 = (Matrix *)0x0;
      lVar8 = in_ST6;
      do {
        bVar4 = a->columns != 0;
        lVar7 = in_ST0;
        lVar9 = in_ST1;
        if (bVar4) {
          lVar7 = in_ST2;
          lVar9 = in_ST3;
          in_ST2 = in_ST4;
          in_ST3 = in_ST5;
          in_ST4 = in_ST6;
          MatrixGetElement((Real *)a,a_00,0,(uint32_t)uVar1);
          MatrixGetElement((Real *)b,a_00,0,(uint32_t)uVar1);
          in_ST5 = lVar8;
          if (ABS(in_ST0 - in_ST1) < error._0_10_) {
            uVar2 = 1;
            lVar5 = lVar7;
            lVar6 = lVar9;
            do {
              bVar4 = uVar2 < a->columns;
              lVar7 = lVar5;
              lVar9 = lVar6;
              in_ST6 = in_ST5;
              lVar8 = in_ST5;
              if (!bVar4) goto LAB_00108235;
              lVar7 = in_ST2;
              lVar9 = in_ST3;
              in_ST2 = in_ST4;
              in_ST3 = in_ST5;
              in_ST4 = in_ST5;
              MatrixGetElement((Real *)a,a_00,uVar2,(uint32_t)uVar1);
              MatrixGetElement((Real *)b,a_00,uVar2,(uint32_t)uVar1);
              lVar8 = lVar5 - lVar6;
              uVar2 = uVar2 + 1;
              lVar5 = lVar7;
              lVar6 = lVar9;
            } while (ABS(lVar8) < error._0_10_);
          }
          in_ST6 = in_ST5;
          lVar8 = in_ST5;
          if (bVar4) {
            return bVar3;
          }
        }
LAB_00108235:
        uVar2 = (int)a_00 + 1;
        a_00 = (Matrix *)(ulong)uVar2;
        bVar4 = uVar2 < a->rows;
        bVar3 = !bVar4;
        in_ST0 = lVar7;
        in_ST1 = lVar9;
      } while (bVar4);
    }
  }
  else {
    bVar3 = false;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixCompareLoose",uVar1,
            (ulong)a->columns,(ulong)b->rows,b->columns);
  }
  return bVar3;
}

Assistant:

bool MatrixCompareLoose(const Matrix *a, const Matrix *b, Real error) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return false;
  }
#endif
  for (uint32_t row = 0; row < a->rows; ++row) {
    for (uint32_t col = 0; col < a->columns; ++col) {
      if (fabsl(MatrixGetElement(a, row, col) - MatrixGetElement(b, row, col)) >= error) {
        return false;
      }
    }
  }
  return true;
}